

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateDescriptor.cpp
# Opt level: O0

void __thiscall
amrex::StateDescriptor::setComponent
          (StateDescriptor *this,int comp,string *nm,BCRec *bcr,BndryFunc *func,InterpBase *a_interp
          ,bool a_primary,int a_groupsize)

{
  uint *puVar1;
  int *piVar2;
  BndryFunc *in_RCX;
  BCRec *in_RDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  InterpBase *in_R8;
  StateDescriptor *unaff_retaddr;
  byte in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_fffffffffffffff0;
  
  uVar3 = 0xffffffff;
  uVar4 = 0xffffffff;
  setComponent(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),
               (string *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,in_RCX,in_R8,
               in_stack_00000010,in_stack_00000018);
  puVar1 = (uint *)Vector<int,_std::allocator<int>_>::operator[]
                             ((Vector<int,_std::allocator<int>_> *)
                              CONCAT44(in_stack_ffffffffffffffb4,uVar4),
                              CONCAT44(in_stack_ffffffffffffffac,uVar3));
  *puVar1 = (uint)(in_stack_00000008 & 1);
  piVar2 = Vector<int,_std::allocator<int>_>::operator[]
                     ((Vector<int,_std::allocator<int>_> *)CONCAT44(in_stack_ffffffffffffffb4,uVar4)
                      ,CONCAT44(in_stack_ffffffffffffffac,uVar3));
  *piVar2 = in_stack_00000010;
  return;
}

Assistant:

void
StateDescriptor::setComponent (int                               comp,
                               const std::string&                nm,
                               const BCRec&                      bcr,
                               const StateDescriptor::BndryFunc& func,
                               InterpBase*                       a_interp,
                               bool                              a_primary,
                               int                               a_groupsize)
{
    setComponent(comp,nm,bcr,func,a_interp,-1,-1);

    m_primary[comp]    = a_primary;
    m_groupsize[comp] = a_groupsize;
}